

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handheld-halting.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ins_e e;
  ins_e iVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  ostream *poVar4;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar5;
  undefined8 in_RCX;
  int iVar6;
  ulong uVar7;
  long lVar8;
  string_view sVar9;
  program_t copy;
  program_t program;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  _Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_> local_298;
  _Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_> local_280;
  ins_e local_268 [6];
  machine_t local_250;
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_> local_240;
  
  get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)&local_240,argc,
            argv);
  if (local_240._M_index == '\0') {
    pvVar5 = std::get<0ul,int,std::ifstream>
                       ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                        &local_240);
    iVar6 = *pvVar5;
  }
  else {
    file_00 = std::get<1ul,int,std::ifstream>
                        ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_240);
    tokenize_abi_cxx11_<std::ifstream>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_298,file_00);
    handheld::read_program
              ((program_t *)&local_280,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_298);
    poVar4 = std::operator<<((ostream *)&std::cout,"Part 1: ");
    auVar2._4_8_ = 0;
    auVar2._0_4_ = (uint)in_RCX;
    local_298._M_impl.super__Vector_impl_data._0_12_ =
         handheld::execute((handheld *)&local_280,(program_t *)0x0,(machine_t)(auVar2 << 0x40));
    operator<<(poVar4,(machine_t *)&local_298);
    std::operator<<(poVar4,"\n");
    local_268[0] = jmp;
    local_268[1] = nop;
    local_268[2] = nop;
    local_268[3] = jmp;
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 8) {
      for (uVar7 = 0;
          uVar7 < (ulong)((long)local_280._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_280._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar7 = uVar7 + 1) {
        std::vector<handheld::instr_t,_std::allocator<handheld::instr_t>_>::vector
                  ((vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)&local_298,
                   (vector<handheld::instr_t,_std::allocator<handheld::instr_t>_> *)&local_280);
        e = local_298._M_impl.super__Vector_impl_data._M_start[uVar7].ins;
        if (e == *(ins_e *)((long)local_268 + lVar8)) {
          iVar1 = *(ins_e *)((long)local_268 + lVar8 + 4);
          local_298._M_impl.super__Vector_impl_data._M_start[uVar7].ins = iVar1;
          auVar3._4_8_ = 0;
          auVar3._0_4_ = iVar1;
          local_250 = handheld::execute((handheld *)&local_298,(program_t *)0x0,
                                        (machine_t)(auVar3 << 0x40));
          if (local_250.exit == normal) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Part 2: Changed instruction ");
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4," ");
            sVar9 = handheld::ins_str(e);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,sVar9._M_str,sVar9._M_len);
            poVar4 = std::operator<<(poVar4," to ");
            sVar9 = handheld::ins_str(*(ins_e *)((long)local_268 + lVar8 + 4));
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,sVar9._M_str,sVar9._M_len);
            poVar4 = std::operator<<(poVar4,"; ");
            operator<<(poVar4,&local_250);
            std::operator<<(poVar4,"\n");
          }
        }
        std::_Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>::~_Vector_base
                  (&local_298);
      }
    }
    std::_Vector_base<handheld::instr_t,_std::allocator<handheld::instr_t>_>::~_Vector_base
              (&local_280);
    iVar6 = 0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
  ~_Variant_storage(&local_240);
  return iVar6;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  using namespace handheld;
  
  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto program = read_program(tokenize(input));

  std::cout << "Part 1: " << execute(program) << "\n";

  using from_to_t = std::pair<ins_e, ins_e>;
  for (const auto& [from, to] : { from_to_t{ins_e::jmp, ins_e::nop}, {ins_e::nop, ins_e::jmp} }) {
    for (size_t i = 0; i < program.size(); i++) {
      auto copy = program;
      if (copy[i].ins == from) {
        copy[i].ins = to;
        auto machine = execute(copy);
        if (machine.exit == machine_t::exit_e::normal)
          std::cout << "Part 2: Changed instruction " << i << " " << ins_str(from) << " to " << ins_str(to) << "; " << machine << "\n";
      }
    }
  }
}